

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::ConeRecord2::Encode(ConeRecord2 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>
            (stream,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>
            (stream,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui16Length);
  KDataStream::Write(stream,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Index);
  KDataStream::Write(stream,(this->super_ConeRecord1).super_EnvironmentRecord.m_ui8Padding);
  (*(this->super_ConeRecord1).m_Loc.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_ConeRecord1).m_Loc,stream);
  (*(this->super_ConeRecord1).m_Ori.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_ConeRecord1).m_Ori,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  KDataStream::Write<float>(stream,(float)(this->super_ConeRecord1).m_f32Height);
  KDataStream::Write<float>(stream,(float)this->m_f32ddtHeight);
  KDataStream::Write<float>(stream,(float)(this->super_ConeRecord1).m_f32PeakAngle);
  KDataStream::Write<float>(stream,(float)this->m_f32ddtPeak);
  KDataStream::Write<unsigned_int>(stream,(this->super_ConeRecord1).m_ui32Padding);
  return;
}

Assistant:

void ConeRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32Height
           << m_f32ddtHeight
           << m_f32PeakAngle
           << m_f32ddtPeak
           << m_ui32Padding;
}